

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

uint __thiscall
sisl::array_n<int,_3,_std::allocator<int>_>::linear_index
          (array_n<int,_3,_std::allocator<int>_> *this,uint d0,__va_list_tag *vl)

{
  uint uVar1;
  undefined8 *puVar2;
  long lVar3;
  uint *puVar4;
  
  if (d0 < this->_dims[0]) {
    uVar1 = vl->gp_offset;
    lVar3 = 0;
    while( true ) {
      if (lVar3 == 2) {
        return d0;
      }
      if (uVar1 < 0x29) {
        puVar4 = (uint *)((ulong)uVar1 + (long)vl->reg_save_area);
        uVar1 = uVar1 + 8;
        vl->gp_offset = uVar1;
      }
      else {
        puVar4 = (uint *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar4 + 2;
      }
      if (this->_dims[lVar3 + 1] <= *puVar4) break;
      d0 = this->_dims[lVar3 + 1] * d0 + *puVar4;
      lVar3 = lVar3 + 1;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "Index out of bounds!";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

inline unsigned int linear_index(unsigned int d0, va_list vl) const {
            unsigned int ret = d0;
            if(ret >= _dims[0]) throw "Index out of bounds!";

            for(unsigned int i = 1; i < N; i++){
                unsigned int dx = va_arg(vl, unsigned int);
                if(dx >= _dims[i]) throw "Index out of bounds!";
                ret = (dx + _dims[i]*ret);
            }
            return ret;
        }